

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O3

void us16_to_us32_test(int line,UTF_US16 *str1,UTF_US32 *str2,bool ok)

{
  char16_t cVar1;
  char16_t cVar2;
  ulong uVar3;
  char32_t *pcVar4;
  char32_t cVar5;
  size_type sVar6;
  pointer pcVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  pointer pcVar11;
  bool bVar12;
  UTF_US32 tmp;
  UTF_UC32 buf [256];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_458;
  char32_t local_438 [258];
  
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  local_458._M_string_length = 0;
  local_458.field_2._M_local_buf[0] = L'\0';
  if (str1->_M_string_length != 0) {
    pcVar11 = (str1->_M_dataplus)._M_p;
    pcVar7 = pcVar11 + str1->_M_string_length;
    do {
      cVar1 = *pcVar11;
      cVar5 = (char32_t)(ushort)cVar1;
      if (((cVar5 & 0xfc00U) != 0xdc00) && ((cVar5 & 0xfc00U) == 0xd800)) {
        pcVar11 = pcVar11 + 1;
        if (pcVar11 == pcVar7) {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (&local_458,L'?');
          break;
        }
        cVar2 = *pcVar11;
        if ((cVar2 & 0xfc00U) == 0xdc00) {
          cVar5 = cVar5 * 0x400 + (uint)(ushort)cVar2 + L'\xfca02400';
        }
        else {
          cVar5 = (uint)(ushort)cVar1;
          if (cVar2 != L'\0') {
            cVar5 = L'?';
          }
        }
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&local_458,cVar5);
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 != pcVar7);
  }
  UTF_test(line,ok);
  uVar3 = str2->_M_string_length;
  sVar6 = local_458._M_string_length;
  if (uVar3 < local_458._M_string_length) {
    sVar6 = uVar3;
  }
  if (sVar6 != 0) {
    uVar9 = 0;
    do {
      if ((str2->_M_dataplus)._M_p[uVar9] != local_458._M_dataplus._M_p[uVar9]) {
        bVar12 = false;
        goto LAB_00101e5f;
      }
      uVar9 = uVar9 + 1;
    } while (sVar6 != uVar9);
  }
  bVar12 = local_458._M_string_length == uVar3;
LAB_00101e5f:
  UTF_test(line,bVar12);
  bVar12 = true;
  if (str1->_M_string_length == 0) {
    pcVar4 = local_438;
  }
  else {
    pcVar7 = (str1->_M_dataplus)._M_p;
    pcVar11 = pcVar7 + str1->_M_string_length;
    lVar8 = 0x3fc;
    pcVar4 = local_438;
    do {
      cVar1 = *pcVar7;
      uVar10 = (ushort)cVar1 & 0xfc00;
      cVar5 = (uint)(ushort)cVar1;
      if ((uVar10 != 0xdc00) && (uVar10 == 0xd800)) {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 != pcVar11) {
          cVar2 = *pcVar7;
          if ((cVar2 & 0xfc00U) == 0xdc00) {
            cVar5 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)cVar2 + L'\xfca02400';
          }
          else {
            cVar5 = (uint)(ushort)cVar1;
            if (cVar2 != L'\0') {
              cVar5 = L'?';
            }
          }
          goto LAB_00101ee8;
        }
        if (lVar8 == 0) {
LAB_00101f1b:
          bVar12 = false;
        }
        else {
          *pcVar4 = L'?';
          pcVar4 = pcVar4 + 1;
        }
        break;
      }
LAB_00101ee8:
      if (lVar8 == 0) goto LAB_00101f1b;
      *pcVar4 = cVar5;
      pcVar7 = pcVar7 + 1;
      lVar8 = lVar8 + -4;
      pcVar4 = pcVar4 + 1;
    } while (pcVar7 != pcVar11);
  }
  *pcVar4 = L'\0';
  UTF_test(line,bVar12);
  cVar5 = *local_458._M_dataplus._M_p;
  if (cVar5 == L'\0') {
    cVar5 = L'\0';
    pcVar4 = local_438;
  }
  else {
    pcVar4 = local_438;
    lVar8 = 0;
    do {
      if (*pcVar4 == L'\0') goto LAB_00101f7c;
      bVar12 = local_458._M_string_length + 1 == lVar8;
      if ((cVar5 != *pcVar4) || (local_458._M_string_length + 1 == lVar8)) goto LAB_00101f82;
      pcVar4 = pcVar4 + 1;
      cVar5 = local_458._M_dataplus._M_p[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (cVar5 != L'\0');
    cVar5 = L'\0';
  }
LAB_00101f7c:
  bVar12 = cVar5 == *pcVar4;
LAB_00101f82:
  UTF_test(line,bVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  return;
}

Assistant:

void us16_to_us32_test(int line, const UTF_US16& str1, const UTF_US32& str2, bool ok)
{
    UTF_US32 tmp;
    UTF_UC32 buf[256];
    UTF_test(line, UTF_u_to_U<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_uj16_to_uj32(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj32_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}